

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  OfType OVar1;
  IConfig *pIVar2;
  pointer pcVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  string *this_00;
  Colour okAnywayColour;
  Colour successColour;
  Colour colour;
  undefined1 local_79 [9];
  ulong local_70;
  undefined1 local_68 [24];
  string local_50;
  
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
  }
  iVar7 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2);
  if ((char)iVar7 == '\0') {
    OVar1 = (assertionResult->m_resultData).resultType;
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
    if (OVar1 == Ok) {
      return;
    }
  }
  else {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
  }
  startSpansLazily(this);
  pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
  local_79._1_8_ = (string *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_79 + 1),pcVar3,
             pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
  uVar5 = local_70;
  local_68._16_8_ = (assertionResult->m_info).lineInfo.line;
  if ((string *)local_79._1_8_ != (string *)local_68) {
    operator_delete((void *)local_79._1_8_);
  }
  if (uVar5 != 0) {
    Colour::Colour((Colour *)&local_50,FileName);
    poVar9 = (this->m_config).m_stream;
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    local_79._1_8_ = (string *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_79 + 1),pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_68._16_8_ = (assertionResult->m_info).lineInfo.line;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_79._1_8_,local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    Colour::~Colour((Colour *)&local_50);
  }
  if ((assertionResult->m_info).capturedExpression._M_string_length != 0) {
    Colour::Colour((Colour *)&local_50,Cyan);
    poVar9 = (this->m_config).m_stream;
    AssertionResult::getExpression_abi_cxx11_((string *)(local_79 + 1),assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_79._1_8_,local_70);
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    if (((assertionResult->m_resultData).resultType & FailureBit) == Ok) {
      Colour::Colour((Colour *)(local_79 + 1),Green);
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream," succeeded",10);
    }
    else {
      Colour::Colour((Colour *)(local_79 + 1),BrightRed);
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream," failed",7);
      if ((((assertionResult->m_resultData).resultType & FailureBit) == Ok) ||
         (((assertionResult->m_info).resultDisposition & SuppressFail) != Normal)) {
        Colour::Colour((Colour *)local_79,Green);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->m_config).m_stream," - but was ok",0xd);
        Colour::~Colour((Colour *)local_79);
      }
    }
    Colour::~Colour((Colour *)(local_79 + 1));
    Colour::~Colour((Colour *)&local_50);
  }
  OVar1 = (assertionResult->m_resultData).resultType;
  if (OVar1 < ExplicitFailure) {
    if (OVar1 < Warning) {
      if ((uint)(OVar1 + Info) < 2) {
LAB_0013159e:
        if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
          if ((OVar1 & FailureBit) == Ok) {
            Colour::Colour((Colour *)(local_79 + 1),Green);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->m_config).m_stream," succeeded",10);
          }
          else {
            Colour::Colour((Colour *)(local_79 + 1),BrightRed);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->m_config).m_stream," failed",7);
            if ((((assertionResult->m_resultData).resultType & FailureBit) == Ok) ||
               (((assertionResult->m_info).resultDisposition & SuppressFail) != Normal)) {
              Colour::Colour((Colour *)&local_50,Green);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->m_config).m_stream," - but was ok",0xd);
              Colour::~Colour((Colour *)&local_50);
            }
          }
          Colour::~Colour((Colour *)(local_79 + 1));
        }
        if ((assertionResult->m_resultData).message._M_string_length == 0) goto LAB_001318dc;
        std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,"\n",1);
        Colour::Colour((Colour *)local_79,ReconstructedExpression);
        local_79._1_8_ = (string *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_79 + 1),"with message","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,
                   pcVar3 + (assertionResult->m_resultData).message._M_string_length);
        streamVariableLengthText(this,(string *)(local_79 + 1),&local_50);
      }
      else {
        if (OVar1 != Info) goto LAB_001318dc;
        Colour::Colour((Colour *)local_79,ReconstructedExpression);
        local_79._1_8_ = (string *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_79 + 1),"info","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,
                   pcVar3 + (assertionResult->m_resultData).message._M_string_length);
        streamVariableLengthText(this,(string *)(local_79 + 1),&local_50);
      }
    }
    else {
      if ((uint)(OVar1 + 0xfffffff0) < 2) goto LAB_0013159e;
      if (OVar1 != Warning) goto LAB_001318dc;
      Colour::Colour((Colour *)local_79,ReconstructedExpression);
      local_79._1_8_ = (string *)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_79 + 1),"warning","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      streamVariableLengthText(this,(string *)(local_79 + 1),&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    this_00 = (string *)local_79;
  }
  else {
    if (OVar1 < ThrewException) {
      if (OVar1 != ExplicitFailure) {
        if (OVar1 != Exception) goto LAB_001318dc;
        goto LAB_0013159e;
      }
      Colour::Colour((Colour *)&local_50,BrightRed);
      poVar9 = (this->m_config).m_stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"failed with message: \'",0x16);
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      local_79._1_8_ = (string *)local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_79 + 1),pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_79._1_8_,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    }
    else {
      if (OVar1 == DidntThrowException) {
        Colour::Colour((Colour *)(local_79 + 1),BrightRed);
        bVar6 = (assertionResult->m_info).capturedExpression._M_string_length == 0;
        pcVar11 = " because no exception was thrown where one was expected";
        if (bVar6) {
          pcVar11 = "No exception thrown where one was expected";
        }
        lVar10 = 0x37;
        if (bVar6) {
          lVar10 = 0x2a;
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,pcVar11,lVar10)
        ;
        this_00 = (string *)(local_79 + 1);
        goto LAB_001318d7;
      }
      if (OVar1 != ThrewException) goto LAB_001318dc;
      Colour::Colour((Colour *)&local_50,BrightRed);
      bVar6 = (assertionResult->m_info).capturedExpression._M_string_length == 0;
      pcVar11 = " with unexpected";
      if (bVar6) {
        pcVar11 = "Unexpected";
      }
      lVar10 = 0x10;
      if (bVar6) {
        lVar10 = 10;
      }
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,pcVar11,lVar10);
      poVar9 = (this->m_config).m_stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," exception with message: \'",0x1a);
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      local_79._1_8_ = (string *)local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_79 + 1),pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_79._1_8_,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    }
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    this_00 = &local_50;
  }
LAB_001318d7:
  Colour::~Colour((Colour *)this_00);
LAB_001318dc:
  bVar6 = AssertionResult::hasExpandedExpression(assertionResult);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream," for: ",6);
    pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_79._1_8_ = (string *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_79 + 1),pcVar3,
               pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
    uVar5 = local_70;
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    if (0x28 < uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,"\n",1);
      pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
      local_79._1_8_ = (string *)local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_79 + 1),pcVar3,
                 pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
      uVar5 = local_70;
      if ((string *)local_79._1_8_ != (string *)local_68) {
        operator_delete((void *)local_79._1_8_);
      }
      if (uVar5 < 0x46) {
        std::__ostream_insert<char,std::char_traits<char>>((this->m_config).m_stream,"\t",1);
      }
    }
    Colour::Colour((Colour *)&local_50,ReconstructedExpression);
    poVar9 = (this->m_config).m_stream;
    pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_79._1_8_ = (string *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_79 + 1),pcVar3,
               pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_79._1_8_,local_70);
    if ((string *)local_79._1_8_ != (string *)local_68) {
      operator_delete((void *)local_79._1_8_);
    }
    Colour::~Colour((Colour *)&local_50);
  }
  poVar9 = (this->m_config).m_stream;
  cVar4 = (char)poVar9;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                Colour colour( Colour::FileName );
                m_config.stream() << assertionResult.getSourceInfo() << ": ";
            }

            if( assertionResult.hasExpression() ) {
                Colour colour( Colour::OriginalExpression );
                m_config.stream() << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    Colour successColour( Colour::Success );
                    m_config.stream() << " succeeded";
                }
                else {
                    Colour errorColour( Colour::Error );
                    m_config.stream() << " failed";
                    if( assertionResult.isOk() ) {
                        Colour okAnywayColour( Colour::Success );
                        m_config.stream() << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " with unexpected";
                        else
                            m_config.stream() << "Unexpected";
                        m_config.stream() << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " because no exception was thrown where one was expected";
                        else
                            m_config.stream() << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        Colour colour( Colour::Error );
                        m_config.stream() << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            Colour colour( Colour::Success );
                            m_config.stream() << " succeeded";
                        }
                        else {
                            Colour colour( Colour::Error );
                            m_config.stream() << " failed";
                            if( assertionResult.isOk() ) {
                                Colour okAnywayColour( Colour::Success );
                                m_config.stream() << " - but was ok";
                            }
                        }
                    }
                    if( assertionResult.hasMessage() ) {
                        m_config.stream() << "\n";
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "with message", assertionResult.getMessage() );
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream() << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream() << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream() << "\t";
                }
                Colour colour( Colour::ReconstructedExpression );
                m_config.stream() << assertionResult.getExpandedExpression();
            }
            m_config.stream() << std::endl;
        }